

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O1

Rectangle deqp::gls::LifetimeTests::details::randomViewport
                    (RenderContext *ctx,GLint maxWidth,GLint maxHeight,Random *rnd)

{
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  ulong uVar5;
  Rectangle RVar6;
  
  iVar2 = (*ctx->_vptr_RenderContext[4])();
  iVar1 = *(int *)CONCAT44(extraout_var,iVar2);
  if (iVar1 < maxWidth) {
    maxWidth = iVar1;
  }
  dVar3 = deRandom_getUint32(&rnd->m_rnd);
  iVar2 = ((int *)CONCAT44(extraout_var,iVar2))[1];
  if (iVar2 < maxHeight) {
    maxHeight = iVar2;
  }
  dVar4 = deRandom_getUint32(&rnd->m_rnd);
  uVar5 = (ulong)dVar3 % (ulong)((iVar1 - maxWidth) + 1) |
          (ulong)dVar4 % (ulong)((iVar2 - maxHeight) + 1) << 0x20;
  RVar6.height = maxHeight;
  RVar6.width = maxWidth;
  RVar6.x = (int)uVar5;
  RVar6.y = (int)(uVar5 >> 0x20);
  return RVar6;
}

Assistant:

Rectangle randomViewport (const RenderContext& ctx, GLint maxWidth, GLint maxHeight,
						  Random& rnd)
{
	const RenderTarget&	target	= ctx.getRenderTarget();
	const GLint			width	= de::min(target.getWidth(), maxWidth);
	const GLint			xOff	= rnd.getInt(0, target.getWidth() - width);
	const GLint			height	= de::min(target.getHeight(), maxHeight);
	const GLint			yOff	= rnd.getInt(0, target.getHeight() - height);

	return Rectangle(xOff, yOff, width, height);
}